

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtb.cc
# Opt level: O3

bool __thiscall dtc::dtb::header::read_dtb(header *this,input_buffer *input)

{
  bool bVar1;
  
  bVar1 = input_buffer::consume_binary<unsigned_int>(input,&this->magic);
  if (bVar1) {
    if (this->magic == 0xd00dfeed) {
      bVar1 = input_buffer::consume_binary<unsigned_int>(input,&this->totalsize);
      if (bVar1) {
        bVar1 = input_buffer::consume_binary<unsigned_int>(input,&this->off_dt_struct);
        if (bVar1) {
          bVar1 = input_buffer::consume_binary<unsigned_int>(input,&this->off_dt_strings);
          if (bVar1) {
            bVar1 = input_buffer::consume_binary<unsigned_int>(input,&this->off_mem_rsvmap);
            if (bVar1) {
              bVar1 = input_buffer::consume_binary<unsigned_int>(input,&this->version);
              if (bVar1) {
                bVar1 = input_buffer::consume_binary<unsigned_int>(input,&this->last_comp_version);
                if (bVar1) {
                  bVar1 = input_buffer::consume_binary<unsigned_int>(input,&this->boot_cpuid_phys);
                  if (bVar1) {
                    bVar1 = input_buffer::consume_binary<unsigned_int>(input,&this->size_dt_strings)
                    ;
                    if (bVar1) {
                      bVar1 = input_buffer::consume_binary<unsigned_int>
                                        (input,&this->size_dt_struct);
                      return bVar1;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      fprintf(_stderr,"Bad magic token in header.  Got %x expected 0xd00dfeed\n");
    }
  }
  else {
    read_dtb();
  }
  return false;
}

Assistant:

bool
header::read_dtb(input_buffer &input)
{
	if (!input.consume_binary(magic))
	{
		fprintf(stderr, "Missing magic token in header.");
		return false;
	}
	if (magic != 0xd00dfeed)
	{
		fprintf(stderr, "Bad magic token in header.  Got %" PRIx32
		                " expected 0xd00dfeed\n", magic);
		return false;
	}
	return input.consume_binary(totalsize) &&
	       input.consume_binary(off_dt_struct) &&
	       input.consume_binary(off_dt_strings) &&
	       input.consume_binary(off_mem_rsvmap) &&
	       input.consume_binary(version) &&
	       input.consume_binary(last_comp_version) &&
	       input.consume_binary(boot_cpuid_phys) &&
	       input.consume_binary(size_dt_strings) &&
	       input.consume_binary(size_dt_struct);
}